

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

size_t slang::parsing::getExtraSize(TokenKind kind)

{
  undefined2 in_register_0000003a;
  size_t sStack_8;
  
  switch(CONCAT22(in_register_0000003a,kind)) {
  case 4:
  case 5:
switchD_001e9727_caseD_4:
    sStack_8 = 0x10;
    break;
  case 6:
    return 0;
  default:
    if (CONCAT22(in_register_0000003a,kind) != 0x157) {
      if (CONCAT22(in_register_0000003a,kind) == 0x158) goto switchD_001e9727_caseD_4;
      if (CONCAT22(in_register_0000003a,kind) != 0x159) {
        return 0;
      }
    }
  case 3:
  case 7:
  case 8:
  case 9:
    sStack_8 = 8;
  }
  return sStack_8;
}

Assistant:

static constexpr size_t getExtraSize(TokenKind kind) {
    size_t size = 0;
    switch (kind) {
        case TokenKind::StringLiteral:
        case TokenKind::IncludeFileName:
            size = sizeof(std::string_view);
            break;
        case TokenKind::RealLiteral:
        case TokenKind::TimeLiteral:
            size = sizeof(double);
            break;
        case TokenKind::IntegerLiteral:
            size = sizeof(SVIntStorage);
            break;
        case TokenKind::UnbasedUnsizedLiteral:
            size = sizeof(logic_t);
            break;
        case TokenKind::Directive:
        case TokenKind::MacroUsage:
            size = sizeof(SyntaxKind);
            break;
        case TokenKind::SystemIdentifier:
            size = sizeof(KnownSystemName);
            break;
        default:
            return 0;
    }

    size_t align = alignof(void*);
    return (size + align - 1) & ~(align - 1);
}